

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O1

void crnd::crnd_free(void *p)

{
  char buf [512];
  char acStack_208 [512];
  
  if (p != (void *)0x0) {
    if (((ulong)p & 7) == 0) {
      (*(code *)g_pRealloc)(p,0,0,1,g_pUser_data);
      return;
    }
    sprintf(acStack_208,"%s(%u): Assertion failure: \"%s\"\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/../inc/crn_decomp.h"
            ,0x99a,"crnd_free: bad ptr");
    puts(acStack_208);
  }
  return;
}

Assistant:

void crnd_free(void* p)
    {
        if (!p)
            return;

        if ((uint32)reinterpret_cast<uintptr_t>(p) & (CRND_MIN_ALLOC_ALIGNMENT - 1))
        {
            crnd_mem_error("crnd_free: bad ptr");
            return;
        }

        (*g_pRealloc)(p, 0, NULL, true, g_pUser_data);
    }